

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ElseClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElseClauseSyntax,slang::parsing::Token&,slang::syntax::SyntaxNode&>
          (BumpAllocator *this,Token *args,SyntaxNode *args_1)

{
  Token elseKeyword;
  ElseClauseSyntax *this_00;
  SyntaxNode *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ElseClauseSyntax *)allocate(this,0x28,8);
  elseKeyword.kind = args->kind;
  elseKeyword._2_1_ = args->field_0x2;
  elseKeyword.numFlags.raw = (args->numFlags).raw;
  elseKeyword.rawLen = args->rawLen;
  elseKeyword.info = args->info;
  slang::syntax::ElseClauseSyntax::ElseClauseSyntax(this_00,elseKeyword,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }